

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_meta_data_map(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  ostream *poVar3;
  pointer pptVar4;
  t_java_generator *this_00;
  char *pcVar5;
  string field_name;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,
                           "public static final java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> metaDataMap;"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"static {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,
                           "java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> tmpMap = new java.util.EnumMap<_Fields, org.apache.thrift.meta_data.FieldMetaData>(_Fields.class);"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    ptVar2 = *pptVar4;
    std::__cxx11::string::string((string *)&stack0xffffffffffffff70,(string *)&ptVar2->name_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"tmpMap.put(_Fields.");
    this_00 = (t_java_generator *)&stack0xffffffffffffff70;
    std::__cxx11::string::string((string *)&stack0xffffffffffffff90,(string *)this_00);
    constant_name((string *)&stack0xffffffffffffffb0,this_00,(string *)&stack0xffffffffffffff90);
    poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffffb0);
    poVar3 = std::operator<<(poVar3,", new org.apache.thrift.meta_data.FieldMetaData(\"");
    poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff70);
    std::operator<<(poVar3,"\", ");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    pcVar5 = "org.apache.thrift.TFieldRequirementType.DEFAULT, ";
    if (ptVar2->req_ == T_OPTIONAL) {
      pcVar5 = "org.apache.thrift.TFieldRequirementType.OPTIONAL, ";
    }
    if (ptVar2->req_ == T_REQUIRED) {
      pcVar5 = "org.apache.thrift.TFieldRequirementType.REQUIRED, ";
    }
    std::operator<<(out,pcVar5);
    generate_field_value_meta_data(this,out,ptVar2->type_);
    poVar3 = std::operator<<(out,"));");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"metaDataMap = java.util.Collections.unmodifiableMap(tmpMap);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"org.apache.thrift.meta_data.FieldMetaData.addStructMetaDataMap(")
  ;
  type_name_abi_cxx11_
            ((string *)&stack0xffffffffffffff70,this,&tstruct->super_t_type,false,false,false,false)
  ;
  poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff70);
  poVar3 = std::operator<<(poVar3,".class, metaDataMap);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_meta_data_map(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Static Map with fieldID -> org.apache.thrift.meta_data.FieldMetaData mappings
  indent(out)
      << "public static final java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> metaDataMap;"
      << endl;
  indent(out) << "static {" << endl;
  indent_up();

  indent(out) << "java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> tmpMap = new "
                 "java.util.EnumMap<_Fields, org.apache.thrift.meta_data.FieldMetaData>(_Fields.class);"
              << endl;

  // Populate map
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    std::string field_name = field->get_name();
    indent(out) << "tmpMap.put(_Fields." << constant_name(field_name)
                << ", new org.apache.thrift.meta_data.FieldMetaData(\"" << field_name << "\", ";

    // Set field requirement type (required, optional, etc.)
    if (field->get_req() == t_field::T_REQUIRED) {
      out << "org.apache.thrift.TFieldRequirementType.REQUIRED, ";
    } else if (field->get_req() == t_field::T_OPTIONAL) {
      out << "org.apache.thrift.TFieldRequirementType.OPTIONAL, ";
    } else {
      out << "org.apache.thrift.TFieldRequirementType.DEFAULT, ";
    }

    // Create value meta data
    generate_field_value_meta_data(out, field->get_type());
    out << "));" << endl;
  }

  indent(out) << "metaDataMap = java.util.Collections.unmodifiableMap(tmpMap);" << endl;

  indent(out) << "org.apache.thrift.meta_data.FieldMetaData.addStructMetaDataMap("
              << type_name(tstruct) << ".class, metaDataMap);" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}